

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.h
# Opt level: O2

cmValue cmTargetPropertyComputer::GetLocation<cmGeneratorTarget>
                  (cmGeneratorTarget *tgt,string *prop,cmMakefile *mf)

{
  pointer pcVar1;
  __type _Var2;
  bool bVar3;
  bool bVar4;
  TargetType TVar5;
  int iVar6;
  string *psVar7;
  string_view str;
  string_view str_00;
  string_view str_01;
  string configName;
  
  TVar5 = cmGeneratorTarget::GetType(tgt);
  if ((((TVar5 != EXECUTABLE) && (TVar5 = cmGeneratorTarget::GetType(tgt), TVar5 != STATIC_LIBRARY))
      && (TVar5 = cmGeneratorTarget::GetType(tgt), TVar5 != SHARED_LIBRARY)) &&
     ((TVar5 = cmGeneratorTarget::GetType(tgt), TVar5 != MODULE_LIBRARY &&
      (TVar5 = cmGeneratorTarget::GetType(tgt), TVar5 != UNKNOWN_LIBRARY)))) {
    return (cmValue)(string *)0x0;
  }
  if ((GetLocation<cmGeneratorTarget>(cmGeneratorTarget_const*,std::__cxx11::string_const&,cmMakefile_const&)
       ::propLOCATION_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&GetLocation<cmGeneratorTarget>(cmGeneratorTarget_const*,std::__cxx11::string_const&,cmMakefile_const&)
                                   ::propLOCATION_abi_cxx11_), iVar6 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &GetLocation<cmGeneratorTarget>(cmGeneratorTarget_const*,std::__cxx11::string_const&,cmMakefile_const&)
                ::propLOCATION_abi_cxx11_,"LOCATION",(allocator<char> *)&configName);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetLocation<cmGeneratorTarget>(cmGeneratorTarget_const*,std::__cxx11::string_const&,cmMakefile_const&)
                  ::propLOCATION_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetLocation<cmGeneratorTarget>(cmGeneratorTarget_const*,std::__cxx11::string_const&,cmMakefile_const&)
                         ::propLOCATION_abi_cxx11_);
  }
  _Var2 = std::operator==(prop,&GetLocation<cmGeneratorTarget>(cmGeneratorTarget_const*,std::__cxx11::string_const&,cmMakefile_const&)
                                ::propLOCATION_abi_cxx11_);
  if (_Var2) {
    bVar3 = cmGeneratorTarget::IsImported(tgt);
    if (!bVar3) {
      psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
      bVar3 = HandleLocationPropertyPolicy(psVar7,mf);
      if (!bVar3) {
        return (cmValue)(string *)0x0;
      }
    }
    ComputeLocationForBuild<cmGeneratorTarget>(tgt);
  }
  else {
    str._M_str = (prop->_M_dataplus)._M_p;
    str._M_len = prop->_M_string_length;
    bVar3 = cmHasLiteralPrefix<10ul>(str,(char (*) [10])"LOCATION_");
    if (!bVar3) {
      str_00._M_str = (prop->_M_dataplus)._M_p;
      str_00._M_len = prop->_M_string_length;
      bVar3 = cmHasLiteralSuffix<10ul>(str_00,(char (*) [10])0x5bedde);
      if (!bVar3) {
        return (cmValue)(string *)0x0;
      }
      str_01._M_str = (prop->_M_dataplus)._M_p;
      str_01._M_len = prop->_M_string_length;
      bVar3 = cmHasLiteralPrefix<17ul>(str_01,(char (*) [17])"XCODE_ATTRIBUTE_");
      if (bVar3) {
        return (cmValue)(string *)0x0;
      }
      pcVar1 = (prop->_M_dataplus)._M_p;
      configName._M_dataplus._M_p = (pointer)&configName.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&configName,pcVar1,pcVar1 + (prop->_M_string_length - 9));
      bVar3 = std::operator!=(&configName,"IMPORTED");
      if (bVar3) {
        bVar4 = cmGeneratorTarget::IsImported(tgt);
        if (!bVar4) {
          psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
          bVar4 = HandleLocationPropertyPolicy(psVar7,mf);
          if (!bVar4) {
            prop = (string *)0x0;
            goto LAB_00397f52;
          }
        }
        cmGeneratorTarget::GetLocation(tgt,&configName);
        prop = &cmGeneratorTarget::GetLocation(std::__cxx11::string_const&)::location_abi_cxx11_;
      }
LAB_00397f52:
      std::__cxx11::string::~string((string *)&configName);
      if (!bVar3) {
        return (cmValue)(string *)0x0;
      }
      return (cmValue)prop;
    }
    bVar3 = cmGeneratorTarget::IsImported(tgt);
    if (!bVar3) {
      psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
      bVar3 = HandleLocationPropertyPolicy(psVar7,mf);
      if (!bVar3) {
        return (cmValue)(string *)0x0;
      }
    }
    std::__cxx11::string::substr((ulong)&configName,(ulong)prop);
    cmGeneratorTarget::GetLocation(tgt,&configName);
    std::__cxx11::string::~string((string *)&configName);
  }
  return (cmValue)&cmGeneratorTarget::GetLocation(std::__cxx11::string_const&)::location_abi_cxx11_;
}

Assistant:

static cmValue GetLocation(Target const* tgt, std::string const& prop,
                             cmMakefile const& mf)

  {
    // Watch for special "computed" properties that are dependent on
    // other properties or variables.  Always recompute them.
    if (tgt->GetType() == cmStateEnums::EXECUTABLE ||
        tgt->GetType() == cmStateEnums::STATIC_LIBRARY ||
        tgt->GetType() == cmStateEnums::SHARED_LIBRARY ||
        tgt->GetType() == cmStateEnums::MODULE_LIBRARY ||
        tgt->GetType() == cmStateEnums::UNKNOWN_LIBRARY) {
      static const std::string propLOCATION = "LOCATION";
      if (prop == propLOCATION) {
        if (!tgt->IsImported() &&
            !HandleLocationPropertyPolicy(tgt->GetName(), mf)) {
          return nullptr;
        }
        return cmValue(ComputeLocationForBuild(tgt));
      }

      // Support "LOCATION_<CONFIG>".
      if (cmHasLiteralPrefix(prop, "LOCATION_")) {
        if (!tgt->IsImported() &&
            !HandleLocationPropertyPolicy(tgt->GetName(), mf)) {
          return nullptr;
        }
        std::string configName = prop.substr(9);
        return cmValue(ComputeLocation(tgt, configName));
      }

      // Support "<CONFIG>_LOCATION".
      if (cmHasLiteralSuffix(prop, "_LOCATION") &&
          !cmHasLiteralPrefix(prop, "XCODE_ATTRIBUTE_")) {
        std::string configName(prop.c_str(), prop.size() - 9);
        if (configName != "IMPORTED") {
          if (!tgt->IsImported() &&
              !HandleLocationPropertyPolicy(tgt->GetName(), mf)) {
            return nullptr;
          }
          return cmValue(ComputeLocation(tgt, configName));
        }
      }
    }
    return nullptr;
  }